

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O3

void check_eq_file(string *src_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string dst_name;
  encoder e;
  string local_470;
  string local_450;
  basic_coder local_430;
  
  pcVar2 = (src_name->_M_dataplus)._M_p;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,pcVar2,pcVar2 + src_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_450);
  paVar1 = &local_470.field_2;
  local_470._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"encoded","");
  encoder::encoder((encoder *)&local_430,src_name,&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar1) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  encoder::encode((encoder *)&local_430);
  basic_coder::~basic_coder(&local_430);
  local_470._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"encoded","");
  decoder::decoder((decoder *)&local_430,&local_470,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar1) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  decoder::decode((decoder *)&local_430);
  basic_coder::~basic_coder(&local_430);
  remove("encoded");
  cmp_files(src_name,&local_450);
  remove(local_450._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void check_eq_file(const std::string& src_name) {
    std::string dst_name = src_name + "_";
    {
        encoder e(src_name, "encoded");
        e.encode();
    }
    {
        decoder d("encoded", dst_name);
        d.decode();
    }

    std::remove("encoded");

    cmp_files(src_name, dst_name);
    std::remove(dst_name.c_str());
}